

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeDeviceGetFabricVertexExp(ze_device_handle_t hDevice,ze_fabric_vertex_handle_t *phVertex)

{
  ze_result_t zVar1;
  
  if (DAT_0010d290 != (code *)0x0) {
    zVar1 = (*DAT_0010d290)();
    return zVar1;
  }
  context_t::get()::count = (ze_fabric_vertex_handle_t)((long)context_t::get()::count + 1);
  *phVertex = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetFabricVertexExp(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        ze_fabric_vertex_handle_t* phVertex             ///< [out] fabric vertex handle corresponding to device
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetFabricVertexExp = context.zeDdiTable.DeviceExp.pfnGetFabricVertexExp;
        if( nullptr != pfnGetFabricVertexExp )
        {
            result = pfnGetFabricVertexExp( hDevice, phVertex );
        }
        else
        {
            // generic implementation
            *phVertex = reinterpret_cast<ze_fabric_vertex_handle_t>( context.get() );

        }

        return result;
    }